

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O2

void __thiscall
cfd::core::ByteData::ByteData
          (ByteData *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *vector)

{
  CfdException *this_00;
  allocator local_41;
  string local_40;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,vector);
  if ((ulong)((long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) >> 0x20 == 0) {
    return;
  }
  local_40._M_dataplus._M_p = "cfdcore_bytedata.cpp";
  local_40._M_string_length._0_4_ = 0x39;
  local_40.field_2._M_allocated_capacity = (long)"CfdSerializeByteData" + 0xc;
  logger::warn<>((CfdSourceLocation *)&local_40,"It exceeds the handling size.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_40,"It exceeds the handling size.",&local_41);
  CfdException::CfdException(this_00,kCfdIllegalStateError,&local_40);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData::ByteData(const std::vector<uint8_t>& vector) : data_(vector) {
  if (data_.size() > std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "It exceeds the handling size.");
    throw CfdException(kCfdIllegalStateError, "It exceeds the handling size.");
  }
}